

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall CTcEmbedBuilderDbl::add_segment(CTcEmbedBuilderDbl *this,CTcPrsNode *cur)

{
  CTcToken *pCVar1;
  size_t sVar2;
  CTcPrsNode *rhs;
  CTcPrsNode *in_RSI;
  CTcPrsNode *newstr;
  size_t len;
  CTcPrsNode *lhs;
  CTPNComma *in_stack_ffffffffffffffd0;
  undefined8 local_10;
  
  pCVar1 = CTcTokenizer::getcur(G_tok);
  sVar2 = CTcToken::get_text_len(pCVar1);
  local_10 = in_RSI;
  if (sVar2 != 0) {
    rhs = (CTcPrsNode *)CTcPrsAllocObj::operator_new(0x263ac0);
    lhs = rhs;
    pCVar1 = CTcTokenizer::getcur(G_tok);
    CTcToken::get_text(pCVar1);
    CTPNDstr::CTPNDstr((CTPNDstr *)in_stack_ffffffffffffffd0,(char *)lhs,(size_t)rhs);
    local_10 = (CTcPrsNode *)CTcPrsAllocObj::operator_new(0x263b09);
    CTPNComma::CTPNComma(in_stack_ffffffffffffffd0,lhs,rhs);
  }
  return local_10;
}

Assistant:

virtual CTcPrsNode *add_segment(CTcPrsNode *cur)
    {
        /*
         *   Combine the part so far with the next string segment, using a
         *   comma operator.  If the next string segment is empty, there's no
         *   need to add anything for it.  
         */
        size_t len = G_tok->getcur()->get_text_len();
        if (len != 0)
        {
            /* create a node for the new string segment */
            CTcPrsNode *newstr = new CTPNDstr(
                G_tok->getcur()->get_text(), len);
            
            /* combine it into the part so far with a comma operator */
            cur = new CTPNComma(cur, newstr);
        }

        /* return the new combined node */
        return cur;
    }